

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# execution.hpp
# Opt level: O2

bool __thiscall diy::Master::ProcessBlock::all_skip(ProcessBlock *this,int i)

{
  pointer puVar1;
  _Head_base<0UL,_diy::Master::BaseCommand_*,_false> _Var2;
  pointer puVar3;
  int iVar4;
  pointer puVar5;
  unique_ptr<diy::Master::BaseCommand,_std::default_delete<diy::Master::BaseCommand>_> *cmd;
  
  puVar1 = (this->master->commands_).
           super__Vector_base<std::unique_ptr<diy::Master::BaseCommand,_std::default_delete<diy::Master::BaseCommand>_>,_std::allocator<std::unique_ptr<diy::Master::BaseCommand,_std::default_delete<diy::Master::BaseCommand>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  puVar3 = (this->master->commands_).
           super__Vector_base<std::unique_ptr<diy::Master::BaseCommand,_std::default_delete<diy::Master::BaseCommand>_>,_std::allocator<std::unique_ptr<diy::Master::BaseCommand,_std::default_delete<diy::Master::BaseCommand>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  do {
    puVar5 = puVar3;
    if (puVar5 == puVar1) break;
    _Var2._M_head_impl =
         (puVar5->_M_t).
         super___uniq_ptr_impl<diy::Master::BaseCommand,_std::default_delete<diy::Master::BaseCommand>_>
         ._M_t.
         super__Tuple_impl<0UL,_diy::Master::BaseCommand_*,_std::default_delete<diy::Master::BaseCommand>_>
         .super__Head_base<0UL,_diy::Master::BaseCommand_*,_false>._M_head_impl;
    iVar4 = (*(_Var2._M_head_impl)->_vptr_BaseCommand[3])(_Var2._M_head_impl,i,this->master);
    puVar3 = puVar5 + 1;
  } while ((char)iVar4 != '\0');
  return puVar5 == puVar1;
}

Assistant:

bool  all_skip(int i) const
  {
      bool skip = true;
      for (auto& cmd : master.commands_)
      {
          if (!cmd->skip(i, master))
          {
              skip = false;
              break;
          }
      }
      return skip;
  }